

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DynamicScalableKReach.cpp
# Opt level: O2

void __thiscall
DynamicScalableKReach::DynamicPartialIndex::construct_bfs
          (DynamicPartialIndex *this,vertex_t s,
          vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
          *graph,vector<unsigned_char,_std::allocator<unsigned_char>_> *dist)

{
  value_type vVar1;
  uint uVar2;
  size_type sVar3;
  uint *puVar4;
  bool bVar5;
  reference pvVar6;
  reference pvVar7;
  byte *pbVar8;
  const_reference pvVar9;
  ulong __n;
  uint *nxt;
  uint *puVar10;
  
  this->back_ = 0;
  this->front_ = 0;
  pvVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at(dist,(ulong)s);
  *pvVar6 = '\0';
  sVar3 = this->back_;
  this->back_ = sVar3 + 1;
  pvVar7 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::at(this->queue_,sVar3);
  *pvVar7 = s;
  do {
    do {
      sVar3 = this->front_;
      if (this->back_ == sVar3) {
        return;
      }
      this->front_ = sVar3 + 1;
      pvVar7 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::at(this->queue_,sVar3);
      __n = (ulong)*pvVar7;
      pbVar8 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at(dist,__n);
    } while (this->k_ <= *pbVar8);
    pvVar9 = std::
             vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             ::at(graph,__n);
    puVar4 = (pvVar9->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    for (puVar10 = (pvVar9->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl
                   .super__Vector_impl_data._M_start; puVar10 != puVar4; puVar10 = puVar10 + 1) {
      pvVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at(dist,(ulong)*puVar10);
      if (*pvVar6 == '?') {
        pvVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at(dist,__n);
        vVar1 = *pvVar6;
        pvVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                           (dist,(ulong)*puVar10);
        *pvVar6 = vVar1 + '\x01';
        if (this->isD2_ == true) {
          bVar5 = indexed(&this->parent_->D1_,*puVar10);
          if (bVar5) goto LAB_00108ba0;
        }
        uVar2 = *puVar10;
        sVar3 = this->back_;
        this->back_ = sVar3 + 1;
        pvVar7 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::at(this->queue_,sVar3);
        *pvVar7 = uVar2;
      }
LAB_00108ba0:
    }
  } while( true );
}

Assistant:

void
DynamicScalableKReach::DynamicPartialIndex::construct_bfs(vertex_t s, const std::vector<std::vector<vertex_t>> &graph,
                                                          std::vector<distance_t> &dist) {
    back_ = 0;
    front_ = 0;
    dist.at(s) = 0;
    queue_.at(back_++) = s;
    while (back_ != front_) {
        auto cur = queue_.at(front_++);
        if (dist.at(cur) >= k_) {
            continue;
        }
        for (const auto &nxt : graph.at(cur)) {
            if (dist.at(nxt) != INF8) {
                continue;
            }
            dist.at(nxt) = dist.at(cur) + 1;
            if (!isD2_ || !parent_.D1_.indexed(nxt)) {
                queue_.at(back_++) = nxt;
            }
        }
    }
}